

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall
spv::Builder::createCompositeCompare
          (Builder *this,Decoration precision,Id value1,Id value2,bool equal)

{
  pointer ppIVar1;
  Id component;
  uint size;
  Id IVar2;
  Id IVar3;
  Op OVar4;
  uint uVar5;
  Id left;
  Vector<unsigned_int> indexes;
  Decoration local_80;
  _Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_68;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  component = makeBoolType(this);
  local_38 = (ulong)value1;
  uVar5 = (this->module).idToInstruction.
          super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_start[local_38]->typeId;
  size = getNumTypeConstituents(this,uVar5);
  ppIVar1 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  OVar4 = ppIVar1[uVar5]->opCode;
  if (OpTypeStruct < OVar4) {
LAB_001bc37d:
    __assert_fail("isAggregateType(valueType) || isMatrixType(valueType)",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                  ,0x7a6,"Id spv::Builder::createCompositeCompare(Decoration, Id, Id, bool)");
  }
  if ((0xf00000U >> (OVar4 & OpTypeOpaque) & 1) == 0) {
    if ((0x71000000U >> (OVar4 & OpTypeOpaque) & 1) == 0) goto LAB_001bc37d;
    if ((int)size < 1) {
      IVar2 = 0;
    }
    else {
      local_40 = (ulong)value2;
      local_48 = (ulong)equal;
      uVar5 = 0;
      left = 0;
      do {
        local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68._M_impl.super__Vector_impl_data._M_start =
             (pointer)::dxil_spv::allocate_in_thread(4);
        local_68._M_impl.super__Vector_impl_data._M_finish =
             local_68._M_impl.super__Vector_impl_data._M_start + 1;
        *local_68._M_impl.super__Vector_impl_data._M_start = uVar5;
        local_68._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_68._M_impl.super__Vector_impl_data._M_finish;
        IVar2 = getContainedTypeId(this,(this->module).idToInstruction.
                                        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start[local_38]->typeId,
                                   uVar5);
        IVar3 = getContainedTypeId(this,(this->module).idToInstruction.
                                        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start[local_40]->typeId,
                                   uVar5);
        IVar2 = createCompositeExtract(this,value1,IVar2,(Vector<unsigned_int> *)&local_68);
        IVar3 = createCompositeExtract(this,value2,IVar3,(Vector<unsigned_int> *)&local_68);
        IVar2 = createCompositeCompare(this,precision,IVar2,IVar3,SUB81(local_48,0));
        if (((uVar5 != 0) &&
            (IVar2 = createBinOp(this,equal + OpLogicalOr,component,left,IVar2),
            precision != DecorationMax)) && (IVar2 != 0)) {
          addDecoration(this,IVar2,precision,-1);
        }
        std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
        ~_Vector_base(&local_68);
        uVar5 = uVar5 + 1;
        left = IVar2;
      } while (size != uVar5);
    }
  }
  else {
    if (uVar5 != ppIVar1[value2]->typeId) {
      __assert_fail("valueType == getTypeId(value2)",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                    ,0x784,"Id spv::Builder::createCompositeCompare(Decoration, Id, Id, bool)");
    }
    OVar4 = getMostBasicTypeClass(this,uVar5);
    if (OVar4 == OpTypeBool) {
      OVar4 = equal ^ OpLogicalNotEqual;
      local_80 = DecorationMax;
    }
    else {
      local_80 = precision;
      if (OVar4 == OpTypeFloat) {
        OVar4 = (uint)!equal * 2 + OpFOrdEqual;
      }
      else {
        OVar4 = equal ^ OpINotEqual;
      }
    }
    if ((this->module).idToInstruction.
        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar5]->opCode - OpTypeBool < 3) {
      IVar2 = createBinOp(this,OVar4,component,value1,value2);
    }
    else {
      IVar2 = makeVectorType(this,component,size);
      IVar2 = createBinOp(this,OVar4,IVar2,value1,value2);
      if ((local_80 != DecorationMax) && (IVar2 != 0)) {
        addDecoration(this,IVar2,local_80,-1);
      }
      IVar2 = createUnaryOp(this,equal | OpAny,component,IVar2);
    }
    if ((local_80 != DecorationMax) && (IVar2 != 0)) {
      addDecoration(this,IVar2,local_80,-1);
    }
  }
  return IVar2;
}

Assistant:

Id Builder::createCompositeCompare(Decoration precision, Id value1, Id value2, bool equal)
{
    Id boolType = makeBoolType();
    Id valueType = getTypeId(value1);

    Id resultId = NoResult;

    int numConstituents = getNumTypeConstituents(valueType);

    // Scalars and Vectors

    if (isScalarType(valueType) || isVectorType(valueType)) {
        assert(valueType == getTypeId(value2));
        // These just need a single comparison, just have
        // to figure out what it is.
        Op op;
        switch (getMostBasicTypeClass(valueType)) {
        case OpTypeFloat:
            op = equal ? OpFOrdEqual : OpFOrdNotEqual;
            break;
        case OpTypeInt:
        default:
            op = equal ? OpIEqual : OpINotEqual;
            break;
        case OpTypeBool:
            op = equal ? OpLogicalEqual : OpLogicalNotEqual;
            precision = NoPrecision;
            break;
        }

        if (isScalarType(valueType)) {
            // scalar
            resultId = createBinOp(op, boolType, value1, value2);
        } else {
            // vector
            resultId = createBinOp(op, makeVectorType(boolType, numConstituents), value1, value2);
            setPrecision(resultId, precision);
            // reduce vector compares...
            resultId = createUnaryOp(equal ? OpAll : OpAny, boolType, resultId);
        }

        return setPrecision(resultId, precision);
    }

    // Only structs, arrays, and matrices should be left.
    // They share in common the reduction operation across their constituents.
    assert(isAggregateType(valueType) || isMatrixType(valueType));

    // Compare each pair of constituents
    for (int constituent = 0; constituent < numConstituents; ++constituent) {
        dxil_spv::Vector<unsigned> indexes(1, constituent);
        Id constituentType1 = getContainedTypeId(getTypeId(value1), constituent);
        Id constituentType2 = getContainedTypeId(getTypeId(value2), constituent);
        Id constituent1 = createCompositeExtract(value1, constituentType1, indexes);
        Id constituent2 = createCompositeExtract(value2, constituentType2, indexes);

        Id subResultId = createCompositeCompare(precision, constituent1, constituent2, equal);

        if (constituent == 0)
            resultId = subResultId;
        else
            resultId = setPrecision(createBinOp(equal ? OpLogicalAnd : OpLogicalOr, boolType, resultId, subResultId), precision);
    }

    return resultId;
}